

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.hpp
# Opt level: O0

int linenoise::getColumns(int ifd,int ofd)

{
  undefined4 __fd;
  int iVar1;
  ssize_t sVar2;
  size_t __n;
  char local_48 [8];
  char seq [32];
  int cols;
  int start;
  winsize ws;
  int ofd_local;
  int ifd_local;
  
  ws._0_4_ = ofd;
  ws._4_4_ = ifd;
  iVar1 = ioctl(1,0x5413,&cols);
  if ((iVar1 == -1) || (cols._2_2_ == 0)) {
    iVar1 = getCursorPosition(ws._4_4_,ws._0_4_);
    if ((iVar1 == -1) ||
       ((sVar2 = write(ws._0_4_,"\x1b[999C",6), sVar2 != 6 ||
        (seq._28_4_ = getCursorPosition(ws._4_4_,ws._0_4_), seq._28_4_ == -1)))) {
      ofd_local = 0x50;
    }
    else {
      if (iVar1 < (int)seq._28_4_) {
        snprintf(local_48,0x20,"\x1b[%dD",(ulong)(uint)(seq._28_4_ - iVar1));
        __fd = ws._0_4_;
        __n = strlen(local_48);
        write(__fd,local_48,__n);
      }
      ofd_local._0_1_ = seq[0x1c];
      ofd_local._1_1_ = seq[0x1d];
      ofd_local._2_1_ = seq[0x1e];
      ofd_local._3_1_ = seq[0x1f];
    }
  }
  else {
    ofd_local = (int)cols._2_2_;
  }
  return ofd_local;
}

Assistant:

inline int getColumns(int ifd, int ofd) {
#ifdef _WIN32
    CONSOLE_SCREEN_BUFFER_INFO b;

    if (!GetConsoleScreenBufferInfo(hOut, &b)) return 80;
    return b.srWindow.Right - b.srWindow.Left;
#else
    struct winsize ws;

    if (ioctl(1, TIOCGWINSZ, &ws) == -1 || ws.ws_col == 0) {
        /* ioctl() failed. Try to query the terminal itself. */
        int start, cols;

        /* Get the initial position so we can restore it later. */
        start = getCursorPosition(ifd,ofd);
        if (start == -1) goto failed;

        /* Go to right margin and get position. */
        if (write(ofd,"\x1b[999C",6) != 6) goto failed;
        cols = getCursorPosition(ifd,ofd);
        if (cols == -1) goto failed;

        /* Restore position. */
        if (cols > start) {
            char seq[32];
            snprintf(seq,32,"\x1b[%dD",cols-start);
            if (write(ofd,seq,strlen(seq)) == -1) {
                /* Can't recover... */
            }
        }
        return cols;
    } else {
        return ws.ws_col;
    }

failed:
    return 80;
#endif
}